

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLuint program;
  float fVar2;
  GLsizei local_50;
  GLuint shader_program;
  int height;
  int width;
  GLint uloc_project;
  GLint uloc_modelview;
  float f;
  int frame;
  double last_update_time;
  double dt;
  GLFWwindow *pGStack_20;
  int iter;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20003,0);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22006,1);
  pGStack_20 = glfwCreateWindow(800,600,"GLFW OpenGL3 Heightmap demo",(GLFWmonitor *)0x0,
                                (GLFWwindow *)0x0);
  if (pGStack_20 != (GLFWwindow *)0x0) {
    glfwSetKeyCallback(pGStack_20,key_callback);
    glfwMakeContextCurrent(pGStack_20);
    gladLoadGL(glfwGetProcAddress);
    program = make_shader_program(vertex_shader_text,fragment_shader_text);
    if (program != 0) {
      (*glad_glUseProgram)(program);
      height = (*glad_glGetUniformLocation)(program,"project");
      width = (*glad_glGetUniformLocation)(program,"modelview");
      fVar2 = tanf(view_angle / 2.0);
      projection_matrix[5] = 1.0 / fVar2;
      projection_matrix[0] = projection_matrix[5] / aspect_ratio;
      projection_matrix[10] = (z_far + z_near) / (z_near - z_far);
      projection_matrix[0xb] = -1.0;
      projection_matrix[0xe] = (z_far * z_near * 2.0) / (z_near - z_far);
      uloc_project = (GLint)projection_matrix[5];
      (*glad_glUniformMatrix4fv)(height,1,'\0',projection_matrix);
      modelview_matrix[0xc] = -5.0;
      modelview_matrix[0xd] = -5.0;
      modelview_matrix[0xe] = -20.0;
      (*glad_glUniformMatrix4fv)(width,1,'\0',modelview_matrix);
      init_map();
      make_mesh(program);
      glfwGetFramebufferSize(pGStack_20,(int *)&shader_program,&local_50);
      (*glad_glViewport)(0,0,shader_program,local_50);
      (*glad_glClearColor)(0.0,0.0,0.0,0.0);
      uloc_modelview = 0;
      dt._4_4_ = 0;
      _f = glfwGetTime();
      while (iVar1 = glfwWindowShouldClose(pGStack_20), iVar1 == 0) {
        uloc_modelview = uloc_modelview + 1;
        (*glad_glClear)(0x4000);
        (*glad_glDrawElements)(1,0x9382,0x1405,(void *)0x0);
        glfwSwapBuffers(pGStack_20);
        glfwPollEvents();
        last_update_time = glfwGetTime();
        if (0.2 < last_update_time - _f) {
          if (dt._4_4_ < 200) {
            update_map(1);
            update_mesh();
            dt._4_4_ = dt._4_4_ + 1;
          }
          _f = last_update_time;
          uloc_modelview = 0;
        }
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
    exit(1);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    int iter;
    double dt;
    double last_update_time;
    int frame;
    float f;
    GLint uloc_modelview;
    GLint uloc_project;
    int width, height;

    GLuint shader_program;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "GLFW OpenGL3 Heightmap demo", NULL, NULL);
    if (! window )
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    /* Register events callback */
    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    /* Prepare opengl resources for rendering */
    shader_program = make_shader_program(vertex_shader_text, fragment_shader_text);

    if (shader_program == 0u)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glUseProgram(shader_program);
    uloc_project   = glGetUniformLocation(shader_program, "project");
    uloc_modelview = glGetUniformLocation(shader_program, "modelview");

    /* Compute the projection matrix */
    f = 1.0f / tanf(view_angle / 2.0f);
    projection_matrix[0]  = f / aspect_ratio;
    projection_matrix[5]  = f;
    projection_matrix[10] = (z_far + z_near)/ (z_near - z_far);
    projection_matrix[11] = -1.0f;
    projection_matrix[14] = 2.0f * (z_far * z_near) / (z_near - z_far);
    glUniformMatrix4fv(uloc_project, 1, GL_FALSE, projection_matrix);

    /* Set the camera position */
    modelview_matrix[12]  = -5.0f;
    modelview_matrix[13]  = -5.0f;
    modelview_matrix[14]  = -20.0f;
    glUniformMatrix4fv(uloc_modelview, 1, GL_FALSE, modelview_matrix);

    /* Create mesh data */
    init_map();
    make_mesh(shader_program);

    /* Create vao + vbo to store the mesh */
    /* Create the vbo to store all the information for the grid and the height */

    /* setup the scene ready for rendering */
    glfwGetFramebufferSize(window, &width, &height);
    glViewport(0, 0, width, height);
    glClearColor(0.0f, 0.0f, 0.0f, 0.0f);

    /* main loop */
    frame = 0;
    iter = 0;
    last_update_time = glfwGetTime();

    while (!glfwWindowShouldClose(window))
    {
        ++frame;
        /* render the next frame */
        glClear(GL_COLOR_BUFFER_BIT);
        glDrawElements(GL_LINES, 2* MAP_NUM_LINES , GL_UNSIGNED_INT, 0);

        /* display and process events through callbacks */
        glfwSwapBuffers(window);
        glfwPollEvents();
        /* Check the frame rate and update the heightmap if needed */
        dt = glfwGetTime();
        if ((dt - last_update_time) > 0.2)
        {
            /* generate the next iteration of the heightmap */
            if (iter < MAX_ITER)
            {
                update_map(NUM_ITER_AT_A_TIME);
                update_mesh();
                iter += NUM_ITER_AT_A_TIME;
            }
            last_update_time = dt;
            frame = 0;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}